

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

string * __thiscall
flow::CastInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,CastInstr *this)

{
  LiteralType local_4c;
  string_view local_48;
  string local_38;
  CastInstr *local_18;
  CastInstr *this_local;
  
  local_18 = this;
  this_local = (CastInstr *)__return_storage_ptr__;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_48,"cast {}");
  local_4c = Value::type((Value *)this);
  fmt::v5::format<flow::LiteralType>(&local_38,local_48,&local_4c);
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CastInstr::to_string() const {
  return formatOne(fmt::format("cast {}", type()));
}